

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void raspicam::_private::Private_Impl::video_buffer_callback
               (MMAL_PORT_T *port,MMAL_BUFFER_HEADER_T *buffer)

{
  uint32_t value;
  MMAL_PORT_USERDATA_T *pMVar1;
  bool bVar2;
  MMAL_STATUS_T MVar3;
  MMAL_BUFFER_HEADER_T *buffer_00;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_38;
  
  pMVar1 = port->userdata;
  local_38._M_device = (mutex_type *)(pMVar1 + 8);
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  if (((pMVar1 == (MMAL_PORT_USERDATA_T *)0x0) || (pMVar1[0x90] != (MMAL_PORT_USERDATA_T)0x1)) ||
     (buffer->length == 0)) {
    bVar2 = false;
  }
  else {
    mmal_buffer_header_mem_lock(buffer);
    membuf<unsigned_char>::resize((membuf<unsigned_char> *)(pMVar1 + 0x98),(ulong)buffer->length);
    memcpy(*(void **)(pMVar1 + 0x98),buffer->data,(ulong)buffer->length);
    pMVar1[0x90] = (MMAL_PORT_USERDATA_T)0x0;
    bVar2 = true;
    mmal_buffer_header_mem_unlock(buffer);
  }
  mmal_buffer_header_release(buffer);
  if (port->is_enabled != 0) {
    buffer_00 = mmal_queue_get((MMAL_QUEUE_T *)**(undefined8 **)(*(long *)pMVar1 + 0x18));
    if (buffer_00 != (MMAL_BUFFER_HEADER_T *)0x0) {
      MVar3 = mmal_port_send_buffer(port,buffer_00);
      if (MVar3 == MMAL_SUCCESS) goto LAB_00109c10;
    }
    printf("Unable to return a buffer to the encoder port");
  }
LAB_00109c10:
  value = *(uint32_t *)(*(long *)pMVar1 + 0x3c);
  if (value != 0) {
    mmal_port_parameter_set_uint32
              (*(MMAL_PORT_T **)(*(long *)(*(long *)pMVar1 + 0x10) + 0x20),0x10043,value);
  }
  if (bVar2) {
    ThreadCondition::BroadCast((ThreadCondition *)(pMVar1 + 0x30));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void Private_Impl::video_buffer_callback ( MMAL_PORT_T *port, MMAL_BUFFER_HEADER_T *buffer ) {
            MMAL_BUFFER_HEADER_T *new_buffer;
            PORT_USERDATA *pData = ( PORT_USERDATA * ) port->userdata;

            bool hasGrabbed=false;
//            pData->_mutex.lock();
             std::unique_lock<std::mutex> lck ( pData->_mutex );
            if ( pData ) {
                if ( pData->wantToGrab &&  buffer->length ) {
                    mmal_buffer_header_mem_lock ( buffer );
                    pData->_buffData.resize ( buffer->length );
                    memcpy ( pData->_buffData.data,buffer->data,buffer->length );
                    pData->wantToGrab =false;
                    hasGrabbed=true;
                    mmal_buffer_header_mem_unlock ( buffer );
                }
            }
            //pData->_mutex.unlock();
           // if ( hasGrabbed ) pData->Thcond.BroadCast(); //wake up waiting client
            // release buffer back to the pool
            mmal_buffer_header_release ( buffer );
            // and send one back to the port (if still open)
            if ( port->is_enabled ) {
                MMAL_STATUS_T status;

                new_buffer = mmal_queue_get ( pData->pstate->video_pool->queue );

                if ( new_buffer )
                    status = mmal_port_send_buffer ( port, new_buffer );

                if ( !new_buffer || status != MMAL_SUCCESS )
                    printf ( "Unable to return a buffer to the encoder port" );
            }

            if ( pData->pstate->shutterSpeed!=0 )
                mmal_port_parameter_set_uint32 ( pData->pstate->camera_component->control, MMAL_PARAMETER_SHUTTER_SPEED, pData->pstate->shutterSpeed ) ;
            if ( hasGrabbed ) pData->Thcond.BroadCast(); //wake up waiting client

        }